

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O3

bool __thiscall PackedVertexPNTCUV::operator==(PackedVertexPNTCUV *this,PackedVertexPNTCUV *other)

{
  bool bVar1;
  
  if ((((((ABS((this->position).field_0.field_0.x - (other->position).field_0.field_0.x) < 0.01) &&
         (ABS((this->position).field_0.field_0.y - (other->position).field_0.field_0.y) < 0.01)) &&
        (ABS((this->position).field_0.field_0.z - (other->position).field_0.field_0.z) < 0.01)) &&
       ((ABS((this->normal).field_0.field_0.x - (other->normal).field_0.field_0.x) < 0.01 &&
        (ABS((this->normal).field_0.field_0.y - (other->normal).field_0.field_0.y) < 0.01)))) &&
      ((ABS((this->normal).field_0.field_0.z - (other->normal).field_0.field_0.z) < 0.01 &&
       ((ABS((this->tangent).field_0.field_0.x - (other->tangent).field_0.field_0.x) < 0.01 &&
        (ABS((this->tangent).field_0.field_0.y - (other->tangent).field_0.field_0.y) < 0.01)))))) &&
     ((ABS((this->tangent).field_0.field_0.z - (other->tangent).field_0.field_0.z) < 0.01 &&
      ((ABS((this->uv).field_0.field_0.x - (other->uv).field_0.field_0.x) < 0.01 &&
       (ABS((this->uv).field_0.field_0.y - (other->uv).field_0.field_0.y) < 0.01)))))) {
    bVar1 = is_near(&this->color,&other->color);
    return bVar1;
  }
  return false;
}

Assistant:

static bool is_near(const glm::vec3 & vecA, const glm::vec3 & vecB) { return is_near(vecA[0], vecB[0]) and is_near(vecA[1], vecB[1]) and is_near(vecA[2], vecB[2]); }